

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> __thiscall
Test::Suite::runTestMethod(Suite *this,TestMethod *method)

{
  uint uVar1;
  int *piVar2;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> pVar3;
  duration<long,_std::ratio<1L,_1000000L>_> local_90;
  bool local_81;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  duration<long,_std::ratio<1L,_1000000L>_> local_78;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  time_point endTime;
  AssertionFailedException *anon_var_0;
  exception *e;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point startTime;
  bool exceptionThrown;
  TestMethod *method_local;
  Suite *this_local;
  duration<long,_std::ratio<1L,_1000000L>_> local_10;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  startTime.__d.__r._7_1_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->currentTestMethodName,&method->name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->currentTestMethodArgs,&method->argString);
  this->currentTestSucceeded = true;
  (*this->output->_vptr_Output[4])(this->output,&this->suiteName,method,&method->argString);
  uVar1 = (*this->_vptr_Suite[7])(this,&this->currentTestMethodName);
  if ((uVar1 & 1) == 0) {
    local_81 = false;
    local_90 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::zero();
    pVar3 = std::make_pair<bool,std::chrono::duration<long,std::ratio<1l,1000000l>>>
                      (&local_81,&local_90);
    this_local._0_1_ = pVar3.first;
  }
  else {
    local_38.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    TestMethod::operator()(method,this);
    local_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    (*this->_vptr_Suite[8])(this,&this->currentTestMethodName,(ulong)this->currentTestSucceeded & 1)
    ;
    if ((startTime.__d.__r._7_1_ & 1) == 0) {
      (*this->output->_vptr_Output[5])
                (this->output,&this->suiteName,method,&method->argString,
                 (ulong)(this->currentTestSucceeded & 1));
    }
    local_80.__r = (rep)std::chrono::operator-(&local_70,&local_38);
    local_78.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_80);
    pVar3 = std::make_pair<bool&,std::chrono::duration<long,std::ratio<1l,1000000l>>>
                      (&this->currentTestSucceeded,&local_78);
    this_local._0_1_ = pVar3.first;
  }
  local_10 = pVar3.second.__r;
  pVar3.first = (bool)this_local._0_1_;
  pVar3.second.__r = local_10.__r;
  return pVar3;
}

Assistant:

std::pair<bool, std::chrono::microseconds> Suite::runTestMethod(const TestMethod &method) {
  errno = 0;
  bool exceptionThrown = false;
  currentTestMethodName = method.name;
  currentTestMethodArgs = method.argString;
  currentTestSucceeded = true;
  output->initializeTestMethod(suiteName, method.name, method.argString);
  // run before() before every test
  if (before(currentTestMethodName)) {
    std::chrono::steady_clock::time_point startTime = std::chrono::steady_clock::now();
    try {
      method(static_cast<Suite *>(this));
    } catch (const AssertionFailedException &) {
      currentTestSucceeded = false;
    } catch (const std::exception &e) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, e);
    } catch (...) {
      exceptionThrown = true;
      currentTestSucceeded = false;
      output->printException(suiteName, method.name, method.argString, std::runtime_error("non-exception type thrown"));
    }
    std::chrono::steady_clock::time_point endTime = std::chrono::steady_clock::now();
    // run after() after every test
    after(currentTestMethodName, currentTestSucceeded);
    if (!exceptionThrown) {
      // we don't need to print twice, that the method has failed
      output->finishTestMethod(suiteName, method.name, method.argString, currentTestSucceeded);
    }
    return std::make_pair(
        currentTestSucceeded, std::chrono::duration_cast<std::chrono::microseconds>(endTime - startTime));
  }
  return std::make_pair(false, std::chrono::microseconds::zero());
}